

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QActionPrivate::redoGrab(QActionPrivate *this,QShortcutMap *map)

{
  ShortcutContext context;
  QObject *owner;
  int *piVar1;
  bool bVar2;
  int iVar3;
  ContextMatcher matcher;
  long lVar4;
  QKeySequence *shortcut;
  QKeySequence *this_00;
  long lVar5;
  long in_FS_OFFSET;
  QKeySequence local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  owner = *(QObject **)&this->field_0x8;
  piVar1 = (this->shortcutIds).d.ptr;
  lVar4 = (this->shortcutIds).d.size;
  for (lVar5 = 0; lVar4 << 2 != lVar5; lVar5 = lVar5 + 4) {
    iVar3 = *(int *)((long)piVar1 + lVar5);
    if (iVar3 != 0) {
      QKeySequence::QKeySequence(&local_40);
      QShortcutMap::removeShortcut(map,iVar3,owner,&local_40);
      QKeySequence::~QKeySequence(&local_40);
    }
  }
  QList<int>::clear(&this->shortcutIds);
  this_00 = (this->shortcuts).d.ptr;
  for (lVar4 = (this->shortcuts).d.size << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
    bVar2 = QKeySequence::isEmpty(this_00);
    iVar3 = 0;
    if (!bVar2) {
      context = this->shortcutContext;
      matcher = (ContextMatcher)(**(code **)(*(long *)this + 0x28))(this);
      iVar3 = QShortcutMap::addShortcut(map,owner,this_00,context,matcher);
    }
    QList<int>::append(&this->shortcutIds,iVar3);
    this_00 = this_00 + 1;
  }
  if ((this->field_0x188 & 1) == 0) {
    piVar1 = (this->shortcutIds).d.ptr;
    lVar4 = (this->shortcutIds).d.size;
    for (lVar5 = 0; lVar4 << 2 != lVar5; lVar5 = lVar5 + 4) {
      iVar3 = *(int *)((long)piVar1 + lVar5);
      if (iVar3 != 0) {
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::setShortcutEnabled(map,false,iVar3,owner,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
    }
  }
  if ((this->field_0x174 & 1) == 0) {
    piVar1 = (this->shortcutIds).d.ptr;
    lVar4 = (this->shortcutIds).d.size;
    for (lVar5 = 0; lVar4 << 2 != lVar5; lVar5 = lVar5 + 4) {
      iVar3 = *(int *)((long)piVar1 + lVar5);
      if (iVar3 != 0) {
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::setShortcutAutoRepeat(map,false,iVar3,owner,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QActionPrivate::redoGrab(QShortcutMap &map)
{
    Q_Q(QAction);
    for (int id : std::as_const(shortcutIds)) {
        if (id)
            map.removeShortcut(id, q);
    }

    shortcutIds.clear();
    for (const QKeySequence &shortcut : std::as_const(shortcuts)) {
        if (!shortcut.isEmpty())
            shortcutIds.append(map.addShortcut(q, shortcut, shortcutContext, contextMatcher()));
        else
            shortcutIds.append(0);
    }
    if (!enabled) {
        for (int id : std::as_const(shortcutIds)) {
            if (id)
                map.setShortcutEnabled(false, id, q);
        }
    }
    if (!autorepeat) {
        for (int id : std::as_const(shortcutIds)) {
            if (id)
                map.setShortcutAutoRepeat(false, id, q);
        }
    }
}